

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::declareTypeDefaults
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  if ((publicType->basicType == EbtAtomicUint) &&
     ((short)((ulong)*(undefined8 *)&(publicType->qualifier).field_0x1c >> 0x20) != -1)) {
    uVar1 = *(ulong *)&(publicType->qualifier).field_0x1c;
    if (((uint)(uVar1 >> 0x20) & 0xffff) < (uint)(this->resources).maxAtomicCounterBindings) {
      if ((publicType->qualifier).layoutOffset == -1) {
        return;
      }
      this->atomicUintOffsets[uVar1 >> 0x20 & 0xffff] = (publicType->qualifier).layoutOffset;
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar4 = "atomic_uint binding is too large";
    pcVar3 = "binding";
  }
  else {
    if (publicType->arraySizes != (TArraySizes *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"expect an array name","","");
    }
    bVar2 = TQualifier::hasNonXfbLayout(&publicType->qualifier);
    if (((!bVar2) &&
        (((uint)*(undefined8 *)&(publicType->qualifier).field_0x24 & 0x7fffffff) == 0x7fffffff)) ||
       ((publicType->qualifier).layoutBufferReference != false)) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
    pcVar4 = "useless application of layout qualifier";
    pcVar3 = "layout";
  }
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar4,pcVar3,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::declareTypeDefaults(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (publicType.basicType == EbtAtomicUint && publicType.qualifier.hasBinding()) {
        if (publicType.qualifier.layoutBinding >= (unsigned int)resources.maxAtomicCounterBindings) {
            error(loc, "atomic_uint binding is too large", "binding", "");
            return;
        }
        if (publicType.qualifier.hasOffset())
            atomicUintOffsets[publicType.qualifier.layoutBinding] = publicType.qualifier.layoutOffset;
        return;
    }

    if (publicType.arraySizes) {
        error(loc, "expect an array name", "", "");
    }

    if (publicType.qualifier.hasLayout() && !publicType.qualifier.hasBufferReference())
        warn(loc, "useless application of layout qualifier", "layout", "");
}